

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

char * deqp::gles2::Functional::BufferTestUtil::getBufferTargetName(deUint32 target)

{
  char *pcStack_10;
  deUint32 target_local;
  
  if (target == 0x8892) {
    pcStack_10 = "array";
  }
  else if (target == 0x8893) {
    pcStack_10 = "element_array";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getBufferTargetName (deUint32 target)
{
	switch (target)
	{
		case GL_ARRAY_BUFFER:				return "array";
		case GL_ELEMENT_ARRAY_BUFFER:		return "element_array";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}